

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmwCmpxchg<unsigned_int,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Store *store;
  Result RVar1;
  RunResult RVar2;
  Value VVar3;
  Value VVar4;
  Value VVar5;
  uint old;
  Ptr *local_88;
  Ptr memory;
  Ptr local_68;
  string local_50;
  
  local_88 = out_trap;
  RefPtr<wabt::interp::Memory>::RefPtr
            (&memory,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar3 = Pop(this);
  VVar4 = Pop(this);
  VVar5 = Pop(this);
  RVar1 = Memory::AtomicRmwCmpxchg<unsigned_int>
                    (memory.obj_,VVar5.i32_,instr.field_2.imm_u32x2.snd,VVar4.i32_,VVar3.i32_,&old);
  if (RVar1.enum_ == Error) {
    store = this->store_;
    StringPrintf_abi_cxx11_
              (&local_50,"invalid atomic access at %u+%u",VVar5.i64_ & 0xffffffff,
               (ulong)instr.field_2.imm_u32x2.snd);
    Trap::New(&local_68,store,&local_50,&this->frames_);
    local_88->obj_ = local_68.obj_;
    local_88->store_ = local_68.store_;
    local_88->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar2 = Trap;
  }
  else {
    Push<unsigned_int>(this,old);
    RVar2 = Ok;
  }
  RefPtr<wabt::interp::Memory>::reset(&memory);
  return RVar2;
}

Assistant:

RunResult Thread::DoAtomicRmwCmpxchg(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V replace = static_cast<V>(Pop<T>());
  V expect = static_cast<V>(Pop<T>());
  V old;
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->AtomicRmwCmpxchg(offset, instr.imm_u32x2.snd, expect,
                                          replace, &old)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<T>(old));
  return RunResult::Ok;
}